

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

nng_err nni_http_hijack(nni_http_conn *conn)

{
  void *pvVar1;
  nni_mtx *mtx;
  
  pvVar1 = nni_http_conn_get_ctx(conn);
  if (pvVar1 != (void *)0x0) {
    mtx = (nni_mtx *)(*(long *)((long)pvVar1 + 0x18) + 0xd0);
    nni_http_conn_set_ctx(conn,(void *)0x0);
    nni_mtx_lock(mtx);
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    nni_mtx_unlock(mtx);
  }
  return NNG_OK;
}

Assistant:

nng_err
nni_http_hijack(nni_http_conn *conn)
{
	http_sconn *sc;

	sc = nni_http_conn_get_ctx(conn);
	if (sc != NULL) {
		nni_http_server *s = sc->server;
		nni_http_conn_set_ctx(conn, NULL);

		nni_mtx_lock(&s->mtx);
		sc->conn = NULL;
		nni_mtx_unlock(&s->mtx);
	}
	return (NNG_OK);
}